

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  StringPtr value;
  Reader decl;
  int iVar3;
  undefined4 extraout_var;
  CompiledModule *pCVar4;
  _Base_ptr p_Var5;
  ElementCount index;
  bool bVar6;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  Builder entry;
  Fault local_110;
  PointerBuilder local_108;
  StructReader local_e8;
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  local_b8;
  StructBuilder local_88;
  StructReader local_60;
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  _::OrphanBuilder::asStructReader(&local_e8,&(this->content).builder,(StructSize)0x10000);
  bVar6 = local_e8.pointerCount == 0;
  local_88.data = local_e8.pointers;
  if (bVar6) {
    local_88.data = (WirePointer *)0x0;
  }
  local_88.pointers._0_4_ = 0x7fffffff;
  if (!bVar6) {
    local_88.pointers._0_4_ = local_e8.nestingLimit;
  }
  local_88.segment._0_4_ = 0;
  local_88.segment._4_4_ = 0;
  local_88.capTable._0_4_ = 0;
  local_88.capTable._4_4_ = 0;
  if (!bVar6) {
    local_88.segment._0_4_ = local_e8.segment._0_4_;
    local_88.segment._4_4_ = local_e8.segment._4_4_;
    local_88.capTable._0_4_ = local_e8.capTable._0_4_;
    local_88.capTable._4_4_ = local_e8.capTable._4_4_;
  }
  _::PointerReader::getStruct(&local_60,(PointerReader *)&local_88,(word *)0x0);
  decl._reader.capTable = local_60.capTable;
  decl._reader.segment = local_60.segment;
  decl._reader.data = local_60.data;
  decl._reader.pointers = local_60.pointers;
  decl._reader.dataSize = local_60.dataSize;
  decl._reader.pointerCount = local_60.pointerCount;
  decl._reader._38_2_ = local_60._38_2_;
  decl._reader.nestingLimit = local_60.nestingLimit;
  decl._reader._44_4_ = local_60._44_4_;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   &local_b8);
  _::OrphanBuilder::initStructList
            ((OrphanBuilder *)&local_e8,orphanage.arena,orphanage.capTable,
             (ElementCount)local_b8._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x10001)
  ;
  (__return_storage_ptr__->builder).segment =
       (SegmentBuilder *)CONCAT44(local_e8.capTable._4_4_,local_e8.capTable._0_4_);
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_e8.data;
  (__return_storage_ptr__->builder).location = (word *)local_e8.pointers;
  (__return_storage_ptr__->builder).tag.content =
       CONCAT44(local_e8.segment._4_4_,local_e8.segment._0_4_);
  _::OrphanBuilder::asStructList
            ((ListBuilder *)&local_e8,&__return_storage_ptr__->builder,(StructSize)0x10001);
  if ((_Rb_tree_header *)local_b8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b8._M_impl.super__Rb_tree_header) {
    index = 0;
    p_Var5 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar1 = *(undefined8 *)(p_Var5 + 1);
      p_Var2 = p_Var5[1]._M_parent;
      value.content = *(ArrayPtr<const_char> *)(p_Var5 + 1);
      _::ListBuilder::getStructElement(&local_88,(ListBuilder *)&local_e8,index);
      iVar3 = (*(this->parserModule->super_ErrorReporter)._vptr_ErrorReporter[4])
                        (this->parserModule,uVar1,p_Var2);
      if ((Module *)CONCAT44(extraout_var,iVar3) == (Module *)0x0) {
        local_110.exception = (Exception *)0x0;
        local_108.segment = (SegmentBuilder *)0x0;
        local_108.capTable = (CapTableBuilder *)0x0;
        kj::_::Debug::Fault::init
                  (&local_110,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_110);
      }
      pCVar4 = Impl::addInternal(this->compiler,(Module *)CONCAT44(extraout_var,iVar3));
      *(uint64_t *)local_88.data = (pCVar4->rootNode).id;
      local_108.pointer = (WirePointer *)CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers);
      local_108.segment = (SegmentBuilder *)CONCAT44(local_88.segment._4_4_,local_88.segment._0_4_);
      local_108.capTable =
           (CapTableBuilder *)CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
      _::PointerBuilder::setBlob<capnp::Text>(&local_108,(Reader)value.content);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      index = index + 1;
    } while ((_Rb_tree_header *)p_Var5 != &local_b8._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  ::~_Rb_tree(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}